

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::detail::SocketStream::get_remote_ip_and_port(SocketStream *this,string *ip,int *port)

{
  char *pcVar1;
  socklen_t __salen;
  int iVar2;
  socklen_t addr_len;
  sockaddr_storage addr;
  array<char,_1025UL> ipstr;
  socklen_t local_4ac;
  sockaddr local_4a8 [8];
  char local_421 [1025];
  
  local_4ac = 0x80;
  iVar2 = getpeername(this->sock_,local_4a8,&local_4ac);
  __salen = local_4ac;
  if (iVar2 == 0) {
    if ((local_4a8[0].sa_family | 8) == 10) {
      *port = (uint)(ushort)(local_4a8[0].sa_data._0_2_ << 8 |
                            (ushort)local_4a8[0].sa_data._0_2_ >> 8);
    }
    memset(local_421,0,0x401);
    iVar2 = getnameinfo(local_4a8,__salen,local_421,0x401,(char *)0x0,0,1);
    if (iVar2 == 0) {
      pcVar1 = (char *)ip->_M_string_length;
      strlen(local_421);
      std::__cxx11::string::_M_replace((ulong)ip,0,pcVar1,(ulong)local_421);
    }
  }
  return;
}

Assistant:

inline void SocketStream::get_remote_ip_and_port(std::string &ip,
														 int &port) const {
			return detail::get_remote_ip_and_port(sock_, ip, port);
		}